

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O2

void run_container_xor(run_container_t *src_1,run_container_t *src_2,run_container_t *dst)

{
  uint16_t start;
  uint16_t start_00;
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  
  iVar2 = src_2->n_runs + src_1->n_runs;
  if (dst->capacity < iVar2) {
    run_container_grow(dst,iVar2,false);
  }
  dst->n_runs = 0;
  uVar1 = 0;
  lVar3 = 0;
  do {
    uVar4 = (ulong)uVar1;
    lVar3 = (long)(int)lVar3;
    while( true ) {
      iVar2 = src_1->n_runs;
      if ((iVar2 <= (int)uVar1) || (src_2->n_runs <= (int)lVar3)) {
        for (; (long)uVar4 < (long)iVar2; uVar4 = uVar4 + 1) {
          run_container_smart_append_exclusive
                    (dst,src_1->runs[uVar4].value,src_1->runs[uVar4].length);
          iVar2 = src_1->n_runs;
        }
        for (; lVar3 < src_2->n_runs; lVar3 = lVar3 + 1) {
          run_container_smart_append_exclusive
                    (dst,src_2->runs[lVar3].value,src_2->runs[lVar3].length);
        }
        return;
      }
      start = src_1->runs[uVar4].value;
      start_00 = src_2->runs[lVar3].value;
      if (start <= start_00) break;
      run_container_smart_append_exclusive(dst,start_00,src_2->runs[lVar3].length);
      lVar3 = lVar3 + 1;
    }
    run_container_smart_append_exclusive(dst,start,src_1->runs[uVar4].length);
    uVar1 = uVar1 + 1;
  } while( true );
}

Assistant:

void run_container_xor(const run_container_t *src_1,
                       const run_container_t *src_2, run_container_t *dst) {
    // don't bother to convert xor with full range into negation
    // since negation is implemented similarly

    const int32_t neededcapacity = src_1->n_runs + src_2->n_runs;
    if (dst->capacity < neededcapacity)
        run_container_grow(dst, neededcapacity, false);

    int32_t pos1 = 0;
    int32_t pos2 = 0;
    dst->n_runs = 0;

    while ((pos1 < src_1->n_runs) && (pos2 < src_2->n_runs)) {
        if (src_1->runs[pos1].value <= src_2->runs[pos2].value) {
            run_container_smart_append_exclusive(dst, src_1->runs[pos1].value,
                                                 src_1->runs[pos1].length);
            pos1++;
        } else {
            run_container_smart_append_exclusive(dst, src_2->runs[pos2].value,
                                                 src_2->runs[pos2].length);
            pos2++;
        }
    }
    while (pos1 < src_1->n_runs) {
        run_container_smart_append_exclusive(dst, src_1->runs[pos1].value,
                                             src_1->runs[pos1].length);
        pos1++;
    }

    while (pos2 < src_2->n_runs) {
        run_container_smart_append_exclusive(dst, src_2->runs[pos2].value,
                                             src_2->runs[pos2].length);
        pos2++;
    }
}